

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<int>::Clear(RepeatedField<int> *this)

{
  bool is_soo_00;
  int iVar1;
  int *begin;
  int *elem;
  bool is_soo;
  RepeatedField<int> *this_local;
  
  is_soo_00 = RepeatedField<int>::is_soo(this);
  begin = unsafe_elements(this,is_soo_00);
  iVar1 = size(this,is_soo_00);
  Destroy(begin,begin + iVar1);
  ExchangeCurrentSize(this,is_soo_00,0);
  return;
}

Assistant:

inline void RepeatedField<Element>::Clear() {
  const bool is_soo = this->is_soo();
  Element* elem = unsafe_elements(is_soo);
  Destroy(elem, elem + size(is_soo));
  ExchangeCurrentSize(is_soo, 0);
}